

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_dist_wtd_convolve_2d_copy_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               ConvolveParams *conv_params)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  CONV_BUF_TYPE *pCVar4;
  ulong uVar5;
  ulong uVar6;
  int x;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  pCVar4 = conv_params->dst;
  iVar1 = conv_params->dst_stride;
  cVar2 = (char)conv_params->round_0 + (char)conv_params->round_1;
  bVar3 = 0xe - cVar2;
  iVar10 = (1 << (0x15U - cVar2 & 0x1f)) + (1 << (0x16U - cVar2 & 0x1f));
  uVar6 = 0;
  uVar5 = (ulong)(uint)w;
  if (w < 1) {
    uVar5 = uVar6;
  }
  if (h < 1) {
    h = 0;
  }
  for (; uVar6 != (uint)h; uVar6 = uVar6 + 1) {
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      uVar8 = ((uint)src[uVar7] << (bVar3 & 0x1f)) + iVar10;
      if (conv_params->do_average == 0) {
        pCVar4[uVar7] = (CONV_BUF_TYPE)uVar8;
      }
      else {
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          uVar8 = (uVar8 & 0xffff) + (uint)pCVar4[uVar7] >> 1;
        }
        else {
          uVar8 = (int)((uVar8 & 0xffff) * conv_params->bck_offset +
                       (uint)pCVar4[uVar7] * conv_params->fwd_offset) >> 4;
        }
        iVar9 = uVar8 + (((1 << (bVar3 & 0x1f)) >> 1) - iVar10);
        if (iVar9 >> (bVar3 & 0x1f) < 1) {
          iVar9 = 0;
        }
        iVar9 = iVar9 >> (bVar3 & 0x1f);
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        dst[uVar7] = (uint8_t)iVar9;
      }
    }
    pCVar4 = pCVar4 + iVar1;
    dst = dst + dst_stride;
    src = src + src_stride;
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_copy_c(const uint8_t *src, int src_stride,
                                     uint8_t *dst, int dst_stride, int w, int h,
                                     ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int bd = 8;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      CONV_BUF_TYPE res = src[y * src_stride + x] << bits;
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}